

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.c
# Opt level: O1

token * dmrC_primary_expression(dmr_C *C,token *token,expression **tree)

{
  byte bVar1;
  longdouble *__return_storage_ptr__;
  global_symbols_t *pgVar2;
  undefined8 uVar3;
  unsigned_long_long uVar4;
  string *psVar5;
  expression *peVar6;
  expression *peVar7;
  int iVar8;
  int *piVar9;
  __int32_t **pp_Var10;
  expression *peVar11;
  ulonglong uVar12;
  char *pcVar13;
  scope *psVar14;
  token *ptVar15;
  char *pcVar16;
  symbol *psVar17;
  uint uVar18;
  uint uVar19;
  long lVar20;
  char **extraout_RDX;
  char *pcVar21;
  position pVar22;
  char **endptr;
  char cVar23;
  uint uVar24;
  longdouble *plVar25;
  char *pcVar26;
  uint uVar27;
  bool bVar28;
  longdouble in_ST0;
  longdouble *local_60;
  position local_58;
  undefined8 local_50;
  expression *local_48;
  expression *expr;
  position local_38;
  
  local_48 = (expression *)0x0;
  pVar22 = token->pos;
  switch(pVar22._0_4_ & 0x3f) {
  case 2:
    psVar17 = dmrC_lookup_symbol((token->field_2).ident,NS_SYMBOL|NS_TYPEDEF);
    ptVar15 = token->next;
    if (psVar17 == (symbol *)0x0) {
      peVar11 = (expression *)(token->field_2).ident;
      pgVar2 = C->S;
      if ((((peVar11 == (expression *)pgVar2->__func___ident) ||
           (peVar11 == (expression *)pgVar2->__FUNCTION___ident)) ||
          (peVar11 == (expression *)pgVar2->__PRETTY_FUNCTION___ident)) &&
         ((C->current_fn != (symbol *)0x0 && (C->current_fn->ident != (ident *)0x0)))) {
        expr = peVar11;
        local_38 = (position)dmrC_alloc_symbol(pgVar2,token->pos,6);
        (((symbol *)local_38)->field_14).field_2.ctype.base_type = &C->S->char_ctype;
        (((symbol *)local_38)->field_14).field_2.ctype.alignment = 1;
        ((symbol *)local_38)->endpos = token->pos;
        psVar17 = dmrC_alloc_symbol(C->S,token->pos,3);
        (psVar17->field_14).field_2.ctype.base_type = (symbol *)local_38;
        (psVar17->field_14).field_2.ctype.alignment = 1;
        (psVar17->field_14).field_2.ctype.modifiers = 4;
        psVar17->endpos = token->pos;
        dmrC_bind_symbol(C->S,psVar17,(ident *)expr,NS_LABEL);
        *(uint *)psVar17 = *(uint *)psVar17 & 0xfffe00ff | 0x1000;
        local_50 = (allocator *)(ulong)C->current_fn->ident->len;
        expr = (expression *)((long)local_50 + 1);
        local_58 = (position)dmrC_allocator_allocate(&C->string_allocator,(size_t)expr);
        memcpy((string *)((long)local_58 + 4),&C->current_fn->ident->field_0x12,(size_t)local_50);
        *(undefined1 *)((long)&((string *)((long)local_58 + 4))->field_0x0 + (long)local_50) = 0;
        *(uint *)local_58 = ((uint)*(string *)local_58 & 0x80000000) + (int)expr;
        pVar22 = token->pos;
        local_50 = &C->expression_allocator;
        peVar11 = (expression *)dmrC_allocator_allocate(local_50,0);
        *(undefined1 *)peVar11 = 2;
        peVar11->pos = pVar22;
        (psVar17->field_14).field_2.initializer = peVar11;
        (peVar11->field_5).field_2.string = (string *)local_58;
        ((psVar17->field_14).field_2.initializer)->ctype = psVar17;
        local_58 = token->pos;
        psVar14 = (scope *)dmrC_allocator_allocate(local_50,0);
        *(undefined1 *)&psVar14->token = 1;
        psVar14->symbols = (symbol_list *)local_58;
        psVar14[1].symbols = (symbol_list *)expr;
        psVar14->next = (scope *)&C->S->int_ctype;
        (psVar17->field_14).field_0.used_in = psVar14;
        (((anon_union_136_3_e2189aaa_for_symbol_15 *)((long)local_38 + 0x48))->field_0).used_in =
             psVar14;
        iVar8 = C->target->bits_in_char * (int)expr;
        (((anon_union_136_3_e2189aaa_for_symbol_15 *)((long)local_38 + 0x48))->field_1).normal =
             iVar8;
        (psVar17->field_14).field_1.normal = iVar8;
      }
      else {
        psVar17 = (symbol *)0x0;
      }
      if ((ident *)(token->field_2).number == C->S->__builtin_types_compatible_p_ident) {
        token = builtin_types_compatible_p_expr(C,token,&local_48);
        break;
      }
      local_38 = (position)psVar17;
      if ((ident *)(token->field_2).number == C->S->__builtin_offsetof_ident) {
        token = builtin_offsetof_expr(C,token,&local_48);
        break;
      }
    }
    else {
      local_38 = (position)psVar17;
      if ((psVar17->field_0x2 & 0x10) != 0) {
        local_38 = token->pos;
        local_48 = (expression *)dmrC_allocator_allocate(&C->expression_allocator,0);
        *(undefined1 *)local_48 = 1;
        local_48->pos = local_38;
        peVar11 = (psVar17->field_14).field_2.initializer;
        iVar8 = peVar11->op;
        pVar22 = peVar11->pos;
        psVar17 = peVar11->ctype;
        uVar3 = *(undefined8 *)&peVar11->field_0x18;
        uVar4 = (peVar11->field_5).field_0.value;
        psVar5 = (peVar11->field_5).field_2.string;
        peVar6 = (peVar11->field_5).field_10.cond_false;
        peVar7 = (peVar11->field_5).field_14.ident_expression;
        *(undefined4 *)&local_48->field_0x0 = *(undefined4 *)&peVar11->field_0x0;
        local_48->op = iVar8;
        local_48->pos = pVar22;
        local_48->ctype = psVar17;
        *(undefined8 *)&local_48->field_0x18 = uVar3;
        (local_48->field_5).field_0.value = uVar4;
        (local_48->field_5).field_2.string = psVar5;
        (local_48->field_5).field_10.cond_false = peVar6;
        (local_48->field_5).field_14.ident_expression = peVar7;
        local_48->pos = token->pos;
        local_48->field_0x1 = 1;
        token = ptVar15;
        break;
      }
    }
    expr = *(expression **)&token->pos;
    peVar11 = (expression *)dmrC_allocator_allocate(&C->expression_allocator,0);
    *(undefined1 *)peVar11 = 3;
    peVar11->pos = (position)expr;
    pVar22 = (position)(symbol *)0x0;
    local_48 = peVar11;
    if ((local_38 != (position)0x0) && (pVar22 = local_38, (*(uint *)local_38 & 0x1ff00) == 0x200))
    {
      dmrC_sparse_error(C,token->pos,"typename in expression");
      pVar22 = (position)0x0;
    }
    (peVar11->field_5).field_2.string = (string *)token->field_2;
    (peVar11->field_5).field_0.value = (unsigned_long_long)pVar22;
    token = ptVar15;
    break;
  case 3:
    local_48 = (expression *)dmrC_allocator_allocate(&C->expression_allocator,0);
    *(undefined1 *)local_48 = 3;
    local_48->pos = pVar22;
    *(undefined2 *)local_48 = 0x103;
    pgVar2 = C->S;
    local_48->ctype = &pgVar2->int_ctype;
    (local_48->field_5).field_3.unop = (expression *)&pgVar2->zero_int;
    (local_48->field_5).field_2.string = (string *)token->field_2;
    goto LAB_00107e78;
  case 4:
    local_48 = (expression *)dmrC_allocator_allocate(&C->expression_allocator,0);
    *(undefined1 *)local_48 = 1;
    local_48->pos = pVar22;
    __return_storage_ptr__ = (longdouble *)(token->field_2).number;
    local_38 = (position)local_48;
    piVar9 = __errno_location();
    *piVar9 = 0;
    if ((*(char *)__return_storage_ptr__ == '0') &&
       (pp_Var10 = __ctype_tolower_loc(),
       (*pp_Var10)[*(byte *)((long)__return_storage_ptr__ + 1)] == 0x62)) {
      iVar8 = 2;
      plVar25 = (longdouble *)((long)__return_storage_ptr__ + 2);
    }
    else {
      iVar8 = 0;
      plVar25 = __return_storage_ptr__;
    }
    uVar12 = strtoull((char *)plVar25,(char **)&local_60,iVar8);
    endptr = extraout_RDX;
    if (local_60 == __return_storage_ptr__) {
LAB_001080e7:
      dmrC_string_to_ld(__return_storage_ptr__,(char *)&local_60,endptr);
      ((anon_union_32_18_55d8ca1e_for_expression_5 *)((long)local_38 + 0x20))->fvalue = in_ST0;
      if (__return_storage_ptr__ != local_60) {
        bVar1 = *(byte *)local_60;
        if (bVar1 == 0) {
LAB_0010850d:
          lVar20 = 0x15c8;
        }
        else {
          if (*(byte *)((long)local_60 + 1) != 0) goto LAB_001080c0;
          lVar20 = 0x14e0;
          if (bVar1 < 0x4c) {
            if (bVar1 == 0) goto LAB_0010850d;
            if (bVar1 != 0x46) goto LAB_001080c0;
          }
          else {
            if (bVar1 != 0x6c) {
              if (bVar1 == 0x66) goto LAB_00108512;
              if (bVar1 != 0x4c) goto LAB_001080c0;
            }
            lVar20 = 0x16b0;
          }
        }
LAB_00108512:
        *(symbol **)((long)local_38 + 0x10) = (symbol *)((long)&C->S->C + lVar20);
        *(undefined2 *)local_38 = 0x21c;
        goto LAB_00107e78;
      }
    }
    else {
      bVar28 = true;
      if (uVar12 == 0xffffffffffffffff) {
        bVar28 = *piVar9 != 0x22;
      }
      iVar8 = 0;
      endptr = (char **)0x0;
      do {
        plVar25 = (longdouble *)((long)local_60 + 1);
        bVar1 = *(byte *)local_60;
        if (bVar1 == 0) {
          cVar23 = '\x04';
        }
        else if ((bVar1 & 0xdf) == 0x4c) {
          cVar23 = '\x05';
          if ((int)endptr == 0) {
            cVar23 = '\0';
            endptr = (char **)0x1;
            if (*(byte *)plVar25 == bVar1) {
              endptr = (char **)0x2;
              plVar25 = (longdouble *)((long)local_60 + 2);
            }
          }
        }
        else {
          cVar23 = '\x02';
          if ((bVar1 & 0xdf) == 0x55) {
            cVar23 = (iVar8 != 0) * '\x05';
            iVar8 = 1;
          }
        }
        local_60 = plVar25;
      } while (cVar23 == '\0');
      if (cVar23 == '\x02') goto LAB_001080e7;
      if (cVar23 == '\x04') {
        if (!bVar28) {
LAB_001086d1:
          pcVar13 = dmrC_show_token(C,token);
          pVar22 = *(position *)((long)local_38 + 8);
          pcVar21 = "constant %s is too big even for unsigned long long";
          goto LAB_001080da;
        }
        bVar28 = iVar8 == 0 && *(char *)__return_storage_ptr__ != '0';
        uVar24 = 0;
        if ((int)endptr == 0) {
          uVar18 = C->target->bits_in_int - 1;
          uVar24 = 1;
          endptr = (char **)0x1;
          if ((uVar12 >> ((byte)uVar18 & 0x3f) & 0xfffffffffffffffe) != 0) goto LAB_001084a0;
          pcVar13 = "";
          uVar27 = 0;
          if ((uVar12 >> ((ulong)uVar18 & 0x3f) & 1) == 0) {
            expr = (expression *)CONCAT44(expr._4_4_,iVar8);
            local_50 = (allocator *)((ulong)local_50._4_4_ << 0x20);
            pcVar21 = "";
          }
          else {
            expr = (expression *)CONCAT44(expr._4_4_,1);
            local_50 = (allocator *)((ulong)local_50._4_4_ << 0x20);
            pcVar21 = pcVar13;
            if (bVar28) goto LAB_001084a0;
          }
          goto LAB_001085ce;
        }
LAB_001084a0:
        uVar18 = uVar24;
        if ((uint)endptr < 2) {
          uVar19 = C->target->bits_in_long - 1;
          uVar18 = 1;
          if ((uVar12 >> ((byte)uVar19 & 0x3f) & 0xfffffffffffffffe) != 0) goto LAB_0010853f;
          pcVar21 = "";
          pcVar13 = " long";
          uVar27 = uVar24;
          if ((uVar12 >> ((ulong)uVar19 & 0x3f) & 1) == 0) {
            local_50 = (allocator *)CONCAT44(local_50._4_4_,1);
            expr = (expression *)CONCAT44(expr._4_4_,iVar8);
          }
          else {
            expr = (expression *)CONCAT44(expr._4_4_,1);
            local_50 = (allocator *)CONCAT44(local_50._4_4_,1);
            uVar18 = 3;
            if (bVar28) goto LAB_0010853f;
          }
        }
        else {
LAB_0010853f:
          uVar24 = C->target->bits_in_longlong - 1;
          if ((uVar12 >> ((byte)uVar24 & 0x3f) & 0xfffffffffffffffe) != 0) goto LAB_001086d1;
          local_50 = (allocator *)CONCAT44(local_50._4_4_,2);
          if ((uVar12 >> ((ulong)uVar24 & 0x3f) & 1) == 0) {
            expr = (expression *)CONCAT44(expr._4_4_,iVar8);
          }
          else {
            expr = (expression *)CONCAT44(expr._4_4_,1);
            if (iVar8 == 0 && *(char *)__return_storage_ptr__ != '0') {
              pcVar13 = dmrC_show_token(C,token);
              dmrC_warning(C,*(position *)((long)local_38 + 8),
                           "decimal constant %s is too big for long long",pcVar13);
            }
          }
          pcVar13 = " long";
          pcVar21 = " long";
          uVar27 = uVar18;
        }
LAB_001085ce:
        local_58 = (position)uVar12;
        if (uVar27 != 0) {
          pcVar16 = dmrC_show_token(C,token);
          pcVar26 = " unsigned";
          if ((int)expr == 0) {
            pcVar26 = "";
          }
          dmrC_warning(C,*(position *)((long)local_38 + 8),"constant %s is so big it is%s%s%s",
                       pcVar16,pcVar26,pcVar13,pcVar21);
        }
        if ((uVar27 & 2) != 0) {
          pcVar13 = dmrC_show_token(C,token);
          dmrC_warning(C,*(position *)((long)local_38 + 8),
                       "decimal constant %s is between LONG_MAX and ULONG_MAX. For C99 that means long long, C90 compilers are very likely to produce unsigned long (and a warning) here"
                       ,pcVar13);
        }
        pVar22 = local_38;
        *(undefined2 *)local_38 = 0x101;
        psVar17 = dmrC_ctype_integer(C,(int)local_50,(int)expr);
        *(symbol **)((long)pVar22 + 0x10) = psVar17;
        (((anon_union_32_18_55d8ca1e_for_expression_5 *)((long)pVar22 + 0x20))->field_0).value =
             (unsigned_long_long)local_58;
        goto LAB_00107e78;
      }
      if (cVar23 != '\x05') goto LAB_00107e78;
    }
LAB_001080c0:
    pcVar13 = dmrC_show_token(C,token);
    pVar22 = *(position *)((long)local_38 + 8);
    pcVar21 = "constant %s is not a valid number";
LAB_001080da:
    dmrC_error_die(C,pVar22,pcVar21,pcVar13);
  case 5:
  case 6:
  case 7:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
    local_48 = (expression *)dmrC_allocator_allocate(&C->expression_allocator,0);
    *(undefined1 *)local_48 = 1;
    local_48->pos = pVar22;
    *(undefined2 *)local_48 = 0x101;
    lVar20 = 0xcb8;
    if ((*(uint *)&token->pos & 0x3e) < 10) {
      lVar20 = 0xa00;
    }
    local_48->ctype = (symbol *)((long)&C->S->C + lVar20);
    dmrC_get_char_constant(C,token,(unsigned_long_long *)&(local_48->field_5).statement);
LAB_00107e78:
    token = token->next;
    break;
  case 0xf:
  case 0x10:
    local_48 = (expression *)dmrC_allocator_allocate(&C->expression_allocator,0);
    *(undefined1 *)local_48 = 2;
    local_48->pos = pVar22;
    token = dmrC_get_string_constant(C,token,local_48);
    break;
  case 0x11:
    if ((token->field_2).special == 0x5b) {
      iVar8 = dmrC_lookup_type(token->next);
      if (iVar8 != 0) {
        pVar22 = token->pos;
        local_48 = (expression *)dmrC_allocator_allocate(&C->expression_allocator,0);
        *(undefined1 *)local_48 = 4;
        local_48->pos = pVar22;
        *(undefined2 *)local_48 = 0x104;
        ptVar15 = dmrC_typename(C,token->next,(symbol **)&(local_48->field_5).statement,(int *)0x0);
        token = dmrC_expect_token(C,ptVar15,0x5d,"in type expression");
      }
    }
    else if ((token->field_2).special == 0x28) {
      peVar11 = (expression *)dmrC_allocator_allocate(&C->expression_allocator,0);
      *(undefined1 *)peVar11 = 9;
      peVar11->pos = pVar22;
      peVar11->op = 0x28;
      local_48 = peVar11;
      token = dmrC_parens_expression
                        (C,token,(expression **)&(peVar11->field_5).statement,"in expression");
      if ((peVar11->field_5).statement != (statement *)0x0) {
        peVar11->field_0x1 = *(byte *)((long)&((peVar11->field_5).statement)->type + 1);
      }
    }
  }
  *tree = local_48;
  return token;
}

Assistant:

struct token *dmrC_primary_expression(struct dmr_C *C, struct token *token, struct expression **tree)
{
	struct expression *expr = NULL;

	switch (dmrC_token_type(token)) {
	case TOKEN_CHAR:
	case TOKEN_CHAR_EMBEDDED_0:
	case TOKEN_CHAR_EMBEDDED_1:
	case TOKEN_CHAR_EMBEDDED_2:
	case TOKEN_CHAR_EMBEDDED_3:
	case TOKEN_WIDE_CHAR:
	case TOKEN_WIDE_CHAR_EMBEDDED_0:
	case TOKEN_WIDE_CHAR_EMBEDDED_1:
	case TOKEN_WIDE_CHAR_EMBEDDED_2:
	case TOKEN_WIDE_CHAR_EMBEDDED_3:
		expr = dmrC_alloc_expression(C, token->pos, EXPR_VALUE);   
		expr->flags = Int_const_expr;
		expr->ctype = dmrC_token_type(token) < TOKEN_WIDE_CHAR ? &C->S->int_ctype : &C->S->long_ctype;
		dmrC_get_char_constant(C, token, &expr->value);
		token = token->next;
		break;

	case TOKEN_NUMBER:
		expr = dmrC_alloc_expression(C, token->pos, EXPR_VALUE);
		get_number_value(C, expr, token); /* will see if it's an integer */
		token = token->next;
		break;

	case TOKEN_ZERO_IDENT: {
		expr = dmrC_alloc_expression(C, token->pos, EXPR_SYMBOL);
		expr->flags = Int_const_expr;
		expr->ctype = &C->S->int_ctype;
		expr->symbol = &C->S->zero_int;
		expr->symbol_name = token->ident;
		token = token->next;
		break;
	}

	case TOKEN_IDENT: {
		struct symbol *sym = dmrC_lookup_symbol(token->ident, NS_SYMBOL | NS_TYPEDEF);
		struct token *next = token->next;

		if (!sym) {
			sym = handle_func(C, token);
			if (token->ident == C->S->__builtin_types_compatible_p_ident) {
				token = builtin_types_compatible_p_expr(C, token, &expr);
				break;
			}
			if (token->ident == C->S->__builtin_offsetof_ident) {
				token = builtin_offsetof_expr(C, token, &expr);
				break;
			}
		} else if (sym->enum_member) {
			expr = dmrC_alloc_expression(C, token->pos, EXPR_VALUE);
			*expr = *sym->initializer;
			/* we want the right position reported, thus the copy */
			expr->pos = token->pos;
			expr->flags = Int_const_expr;
			token = next;
			break;
		}

		expr = dmrC_alloc_expression(C, token->pos, EXPR_SYMBOL);

		/*
		 * We support types as real first-class citizens, with type
		 * comparisons etc:
		 *
		 *	if (typeof(a) == int) ..
		 */
		if (sym && sym->ns == NS_TYPEDEF) {
			dmrC_sparse_error(C, token->pos, "typename in expression");
			sym = NULL;
		}
		expr->symbol_name = token->ident;
		expr->symbol = sym;
		token = next;
		break;
	}

	case TOKEN_STRING:
	case TOKEN_WIDE_STRING:
		expr = dmrC_alloc_expression(C, token->pos, EXPR_STRING);
		token = dmrC_get_string_constant(C, token, expr);
		break;

	case TOKEN_SPECIAL:
		if (token->special == '(') {
			expr = dmrC_alloc_expression(C, token->pos, EXPR_PREOP);
			expr->op = '(';
			token = dmrC_parens_expression(C, token, &expr->unop, "in expression");
			if (expr->unop)
				expr->flags = expr->unop->flags;
			break;
		}
		if (token->special == '[' && dmrC_lookup_type(token->next)) {
			expr = dmrC_alloc_expression(C, token->pos, EXPR_TYPE);
			expr->flags = Int_const_expr; /* sic */
			token = dmrC_typename(C, token->next, &expr->symbol, NULL);
			token = dmrC_expect_token(C, token, ']', "in type expression");
			break;
		}
			
	default:
		;
	}
	*tree = expr;
	return token;
}